

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkPositions::LinkPositions(LinkPositions *this,size_t nrOfLinks)

{
  size_t in_stack_00000048;
  LinkPositions *in_stack_00000050;
  
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::vector
            ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x43730c);
  resize(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

LinkPositions::LinkPositions(std::size_t nrOfLinks)
{
    resize(nrOfLinks);
}